

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QList<bool_(*)(void_**)>_>::relocate
          (QArrayDataPointer<QList<bool_(*)(void_**)>_> *this,qsizetype offset,
          QList<bool_(*)(void_**)> **data)

{
  bool bVar1;
  QList<bool_(*)(void_**)> *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QList<bool_(*)(void_**)> *res;
  
  first = (QList<bool_(*)(void_**)> *)(*(long *)(in_RDI + 8) + in_RSI * 0x18);
  QtPrivate::q_relocate_overlap_n<QList<bool(*)(void**)>,long_long>
            (first,in_RDI,(QList<bool_(*)(void_**)> *)0x2346a4);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QList<bool(*)(void**)>>,QList<bool(*)(void**)>const*>
                        (data,(QArrayDataPointer<QList<bool_(*)(void_**)>_> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x18 + *in_RDX;
  }
  *(QList<bool_(*)(void_**)> **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }